

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm.hpp
# Opt level: O1

bool ft::
     lexicographical_compare<ft::constTreeIterator<int,ft::allocator<ft::treeNode<int>>>,ft::constTreeIterator<int,ft::allocator<ft::treeNode<int>>>,ft::less<int>>
               (long first1,long last1,long first2,long last2)

{
  int iVar1;
  int *piVar2;
  int *piVar3;
  long lVar4;
  long lVar5;
  int *piVar6;
  long lVar7;
  int *piVar8;
  long lVar9;
  bool bVar10;
  
  while( true ) {
    piVar6 = *(int **)(first1 + 0x10);
    if (piVar6 == *(int **)(last1 + 0x10)) {
      return *(long *)(first2 + 0x10) != *(long *)(last2 + 0x10);
    }
    if (*(int **)(first2 + 0x10) == *(int **)(last2 + 0x10)) {
      return false;
    }
    iVar1 = **(int **)(first2 + 0x10);
    if (iVar1 < *piVar6) {
      return false;
    }
    if (*piVar6 < iVar1) break;
    piVar2 = *(int **)(piVar6 + 4);
    piVar3 = (int *)**(undefined8 **)(first1 + 8);
    if (piVar2 == piVar3) {
      do {
        piVar8 = *(int **)(piVar6 + 6);
        bVar10 = *(int **)(piVar8 + 4) == piVar6;
        piVar6 = piVar8;
      } while (bVar10);
    }
    else {
      *(int **)(first1 + 0x10) = piVar2;
      do {
        piVar8 = piVar2;
        piVar2 = *(int **)(piVar8 + 2);
      } while (*(int **)(piVar8 + 2) != piVar3);
    }
    *(int **)(first1 + 0x10) = piVar8;
    lVar4 = *(long *)(*(long *)(first2 + 0x10) + 0x10);
    lVar5 = **(long **)(first2 + 8);
    lVar9 = *(long *)(first2 + 0x10);
    if (lVar4 == lVar5) {
      do {
        lVar7 = *(long *)(lVar9 + 0x18);
        bVar10 = *(long *)(lVar7 + 0x10) == lVar9;
        lVar9 = lVar7;
      } while (bVar10);
    }
    else {
      *(long *)(first2 + 0x10) = lVar4;
      do {
        lVar7 = lVar4;
        lVar4 = *(long *)(lVar7 + 8);
      } while (*(long *)(lVar7 + 8) != lVar5);
    }
    *(long *)(first2 + 0x10) = lVar7;
  }
  return true;
}

Assistant:

bool lexicographical_compare(Iterator1 first1, Iterator1 last1, Iterator2 first2, Iterator2 last2, Compare comp,
							 typename ft::_void_t<typename ft::iterator_traits<Iterator1>::iterator_category>::type * = 0,
							 typename ft::_void_t<typename ft::iterator_traits<Iterator2>::iterator_category>::type * = 0) {
	while (first1 != last1) {
		if (first2 == last2 || comp(*first2, *first1)) return false;
		else if (comp(*first1, *first2)) return true;
		++first1; ++first2;
	}
	return first2 != last2;
}